

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(char lhs,SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  byte bVar1;
  
  if (rhs.m_int == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  if (lhs == '\0') {
    bVar1 = 0;
  }
  else {
    if (rhs.m_int < 0x80) {
      bVar1 = lhs / (char)rhs.m_int;
    }
    else {
      bVar1 = 0;
    }
    if ((char)bVar1 < '\0') {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  return (SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)(ulong)bVar1;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}